

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::optional<pbrt::Token>::optional(optional<pbrt::Token> *this,optional<pbrt::Token> *v)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  Token *pTVar5;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    pTVar5 = value(v);
    pcVar2 = (pTVar5->token)._M_str;
    sVar3 = (pTVar5->loc).filename._M_len;
    pcVar4 = (pTVar5->loc).filename._M_str;
    (this->optionalValue).__align = (anon_struct_8_0_00000001_for___align)(pTVar5->token)._M_len;
    *(char **)((long)&this->optionalValue + 8) = pcVar2;
    *(size_t *)((long)&this->optionalValue + 0x10) = sVar3;
    *(char **)((long)&this->optionalValue + 0x18) = pcVar4;
    *(undefined8 *)((long)&this->optionalValue + 0x20) = *(undefined8 *)&(pTVar5->loc).line;
    reset(v);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }